

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O3

void __thiscall just::test::test_manager::add(test_manager *this,string *name_,_func_void *f_)

{
  pointer pcVar1;
  undefined1 local_38 [8];
  _Alloc_hider local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  pcVar1 = (name_->_M_dataplus)._M_p;
  local_38 = (undefined1  [8])f_;
  local_30._M_p = (pointer)&local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_30,pcVar1,pcVar1 + name_->_M_string_length);
  std::vector<just::test::test_case,_std::allocator<just::test::test_case>_>::
  emplace_back<just::test::test_case>(&this->_cases,(test_case *)local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_p != &local_20) {
    operator_delete(local_30._M_p,local_20._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void add(const std::string& name_, void (*f_)())
      {
        _cases.push_back(test_case(name_, f_));
      }